

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::IslamicCalendar::monthStart(IslamicCalendar *this,int32_t year,int32_t month)

{
  int32_t iVar1;
  int iVar2;
  double dVar3;
  uint local_28;
  int local_24;
  int i;
  int32_t ms;
  int32_t month_local;
  int32_t year_local;
  IslamicCalendar *this_local;
  
  if ((*(int *)&(this->super_Calendar).field_0x264 == 1) ||
     (*(int *)&(this->super_Calendar).field_0x264 == 3)) {
    dVar3 = uprv_ceil_63((double)month * 29.5);
    iVar1 = ClockMath::floorDivide(year * 0xb + 3,0x1e);
    this_local._4_4_ = (int)dVar3 + (year + -1) * 0x162 + iVar1;
  }
  else if (*(int *)&(this->super_Calendar).field_0x264 == 0) {
    this_local._4_4_ = trueMonthStart(this,(year + -1) * 0xc + month);
  }
  else {
    local_24 = yearStart(this,year);
    for (local_28 = 0; (int)local_28 < month; local_28 = local_28 + 1) {
      iVar2 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x22])
                        (this,(ulong)(uint)year,(ulong)local_28);
      local_24 = iVar2 + local_24;
    }
    this_local._4_4_ = local_24;
  }
  return this_local._4_4_;
}

Assistant:

int32_t IslamicCalendar::monthStart(int32_t year, int32_t month) const {
    if (cType == CIVIL || cType == TBLA) {
        // This does not handle months out of the range 0..11
        return (int32_t)uprv_ceil(29.5*month)
            + (year-1)*354 + (int32_t)ClockMath::floorDivide((3+11*year),30);
    } else if(cType==ASTRONOMICAL){
        return trueMonthStart(12*(year-1) + month);
    } else {
        int32_t ms = yearStart(year);
        for(int i=0; i< month; i++){
            ms+= handleGetMonthLength(year, i);
        }
        return ms;
    }
}